

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kalman.cpp
# Opt level: O2

void __thiscall
KalmanFilter::KalmanFilter
          (KalmanFilter *this,double dt,MatrixXd *A,MatrixXd *C,MatrixXd *Q,MatrixXd *R,MatrixXd *P)

{
  int *x;
  
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
            ((DenseStorage<double,__1,__1,__1,_0> *)this,(DenseStorage<double,__1,__1,__1,_0> *)A);
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
            ((DenseStorage<double,__1,__1,__1,_0> *)&this->C,
             (DenseStorage<double,__1,__1,__1,_0> *)C);
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
            ((DenseStorage<double,__1,__1,__1,_0> *)&this->Q,
             (DenseStorage<double,__1,__1,__1,_0> *)Q);
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
            ((DenseStorage<double,__1,__1,__1,_0> *)&this->R,
             (DenseStorage<double,__1,__1,__1,_0> *)R);
  (this->K).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0;
  (this->K).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0;
  (this->P).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0;
  (this->K).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  (this->P).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  (this->P).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
            ((DenseStorage<double,__1,__1,__1,_0> *)&this->P0,
             (DenseStorage<double,__1,__1,__1,_0> *)P);
  this->m = (int)(C->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
                 m_rows;
  x = &this->n;
  this->n = (int)(A->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
                 m_rows;
  this->dt = dt;
  this->initialized = false;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>((Matrix<double,_1,_1,0,_1,_1> *)&this->I,x,x)
  ;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&this->x_hat,x);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&this->x_hat_new,x);
  Eigen::internal::setIdentity_impl<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_false>::run(&this->I);
  return;
}

Assistant:

KalmanFilter::KalmanFilter(
	double dt,
	const Eigen::MatrixXd& A,
	const Eigen::MatrixXd& C,
	const Eigen::MatrixXd& Q,
	const Eigen::MatrixXd& R,
	const Eigen::MatrixXd& P)
	: A(A), C(C), Q(Q), R(R), P0(P),
      m(C.rows()), n(A.rows()), dt(dt), initialized(false),
      I(n, n), x_hat(n), x_hat_new(n)
{
  I.setIdentity();
}